

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeSORegMemOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar2;
  uint32_t Imm12;
  uint32_t uVar3;
  DecodeStatus DVar4;
  uint U;
  uint imm;
  uint type;
  uint Rm;
  uint Rn;
  uint shift;
  ARM_AM_ShiftOpc ShOp;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  shift = 3;
  _ShOp = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Val,0xd,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,5,2);
  Imm12 = fieldFromInstruction_4(Address_local._4_4_,7,5);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0xc,1);
  Rn = 2;
  switch(uVar2) {
  case 0:
    Rn = 2;
    break;
  case 1:
    Rn = 3;
    break;
  case 2:
    Rn = 1;
    break;
  case 3:
    Rn = 4;
  }
  if ((Rn == 4) && (Imm12 == 0)) {
    Rn = 5;
  }
  DVar4 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_ShOp);
  _Var1 = Check(&shift,DVar4);
  if (_Var1) {
    DVar4 = DecodeGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_ShOp);
    _Var1 = Check(&shift,DVar4);
    if (_Var1) {
      if (uVar3 == 0) {
        Rm = ARM_AM_getAM2Opc(ARM_AM_sub,Imm12,Rn,0);
      }
      else {
        Rm = ARM_AM_getAM2Opc(ARM_AM_add,Imm12,Rn,0);
      }
      MCOperand_CreateImm0(pMStack_18,(ulong)Rm);
      Inst_local._4_4_ = shift;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeSORegMemOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc ShOp;
	unsigned shift;
	unsigned Rn = fieldFromInstruction_4(Val, 13, 4);
	unsigned Rm = fieldFromInstruction_4(Val,  0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned imm = fieldFromInstruction_4(Val, 7, 5);
	unsigned U = fieldFromInstruction_4(Val, 12, 1);

	ShOp = ARM_AM_lsl;
	switch (type) {
		case 0:
			ShOp = ARM_AM_lsl;
			break;
		case 1:
			ShOp = ARM_AM_lsr;
			break;
		case 2:
			ShOp = ARM_AM_asr;
			break;
		case 3:
			ShOp = ARM_AM_ror;
			break;
	}

	if (ShOp == ARM_AM_ror && imm == 0)
		ShOp = ARM_AM_rrx;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (U)
		shift = ARM_AM_getAM2Opc(ARM_AM_add, imm, ShOp, 0);
	else
		shift = ARM_AM_getAM2Opc(ARM_AM_sub, imm, ShOp, 0);
	MCOperand_CreateImm0(Inst, shift);

	return S;
}